

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O1

ZyanStatus
ZydisDecoderDecodeInstruction
          (ZydisDecoder *decoder,ZydisDecoderContext *context,void *buffer,ZyanUSize length,
          ZydisDecodedInstruction *instruction)

{
  ZydisMachineMode ZVar1;
  bool bVar2;
  bool bVar3;
  undefined3 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined3 uVar8;
  int iVar9;
  ZyanStatus ZVar10;
  ZyanStatus ZVar11;
  ZydisDecoderContext *pZVar12;
  ulong uVar13;
  ulong unaff_RBP;
  ZyanU8 ZVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte *pbVar19;
  ZyanUSize ZVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  ZydisDecoderState state;
  ZydisDecoderContext default_context;
  byte local_8a;
  byte local_89;
  ZydisDecoderState local_88;
  ZydisDecoderContext local_50;
  
  ZVar11 = 0x80100004;
  if ((instruction != (ZydisDecodedInstruction *)0x0 && decoder != (ZydisDecoder *)0x0) &&
     (ZVar11 = 0x80200000, length != 0 && buffer != (void *)0x0)) {
    local_88.prefixes.has_lock = '\0';
    local_88.prefixes.group1 = '\0';
    local_88.prefixes.group2 = '\0';
    local_88.prefixes.effective_segment = '\0';
    local_88.prefixes.mandatory_candidate = '\0';
    local_88.prefixes.offset_lock = '\0';
    local_88.prefixes.offset_group1 = '\0';
    local_88.prefixes.offset_group2 = '\0';
    local_88.context = context;
    if (context == (ZydisDecoderContext *)0x0) {
      local_88.context = &local_50;
    }
    local_88.prefixes.offset_osz_override = '\0';
    local_88.prefixes.offset_asz_override = '\0';
    local_88.prefixes.offset_segment = '\0';
    local_88.prefixes.offset_mandatory = '\0';
    local_88.prefixes.offset_notrack = -1;
    local_88._45_3_ = 0;
    *(undefined8 *)&((local_88.context)->vector_unified).R2 = 0;
    *(undefined8 *)&((local_88.context)->reg_info).id_base = 0;
    (local_88.context)->definition = (void *)0x0;
    (local_88.context)->eosz_index = '\0';
    (local_88.context)->easz_index = '\0';
    ((local_88.context)->vector_unified).W = '\0';
    ((local_88.context)->vector_unified).R = '\0';
    ((local_88.context)->vector_unified).X = '\0';
    ((local_88.context)->vector_unified).B = '\0';
    ((local_88.context)->vector_unified).L = '\0';
    ((local_88.context)->vector_unified).LL = '\0';
    local_88.decoder = decoder;
    local_88.buffer = (ZyanU8 *)buffer;
    local_88.buffer_len = length;
    memset(instruction,0,0x168);
    ZVar1 = decoder->machine_mode;
    instruction->machine_mode = ZVar1;
    iVar9 = 0x10 << ((char)decoder->stack_width & 0x1f);
    instruction->stack_width = (ZyanU8)iVar9;
    if ((instruction->raw).prefix_count != '\0') {
      __assert_fail("instruction->raw.prefix_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xc0c,
                    "ZyanStatus ZydisCollectOptionalPrefixes(ZydisDecoderState *, ZydisDecodedInstruction *)"
                   );
    }
    bVar17 = instruction->length;
    local_8a = local_88.prefixes.mandatory_candidate;
    ZVar11 = CONCAT31((int3)((uint)iVar9 >> 8),local_88.prefixes.effective_segment);
    local_89 = local_88.prefixes.effective_segment;
    uVar13 = 0;
    ZVar14 = '\0';
    bVar3 = false;
    pbVar19 = local_88.buffer;
    ZVar20 = local_88.buffer_len;
    do {
      uVar5 = local_88.prefixes._0_8_;
      if (bVar17 < 0xf) {
        if (ZVar20 == 0) {
          ZVar10 = 0x80200000;
          goto LAB_00107f21;
        }
        unaff_RBP = (ulong)*pbVar19;
        ZVar10 = 0x100000;
        bVar2 = true;
      }
      else {
        ZVar10 = 0x80200002;
LAB_00107f21:
        bVar2 = false;
      }
      if (bVar2) {
        bVar15 = (byte)unaff_RBP;
        uVar21 = (uint)unaff_RBP & 0xff;
        uVar4 = local_88.prefixes._5_3_;
        uVar7 = local_88._44_4_;
        if (uVar21 < 0x67) {
          uVar23 = uVar21 - 0x26;
          if (uVar23 < 0x40) {
            uVar8 = local_88._45_3_;
            if ((0x1010101UL >> ((ulong)uVar23 & 0x3f) & 1) == 0) {
              if ((0xc000000000000000U >> ((ulong)uVar23 & 0x3f) & 1) == 0) goto LAB_00108009;
            }
            else if (ZVar1 == ZYDIS_MACHINE_MODE_LONG_64) {
              if ((bVar15 == 0x3e) && ((local_89 & 0xfe) != 100)) {
                local_88.prefixes.offset_notrack = ZVar14;
              }
              local_88.prefixes.group2 = bVar15;
              local_88.prefixes.offset_group2 = ZVar14;
              goto LAB_0010804d;
            }
            local_88.prefixes.group2 = bVar15;
            uVar4 = local_88.prefixes._0_3_;
            local_88.prefixes.offset_group2 = ZVar14;
            local_88.prefixes.effective_segment = bVar15;
            local_88.prefixes._0_4_ = CONCAT13(local_88.prefixes.effective_segment,uVar4);
            local_88.prefixes.offset_segment = ZVar14;
            local_88.prefixes.offset_notrack = -1;
            local_88._40_8_ = CONCAT35(uVar8,local_88.prefixes._8_5_);
            local_89 = bVar15;
          }
          else {
LAB_00108009:
            if (uVar21 == 0x66) {
              local_88.prefixes.offset_osz_override = ZVar14;
              if (local_8a == 0) {
                local_88.prefixes.mandatory_candidate = 'f';
                local_88.prefixes._0_8_ = CONCAT35(uVar4,local_88.prefixes._0_5_);
                local_88.prefixes.offset_mandatory = ZVar14;
                local_88._40_8_ = CONCAT44(uVar7,local_88.prefixes._8_4_);
                local_8a = 0x66;
              }
              uVar22 = 0x80000000000;
LAB_00108049:
              instruction->attributes = instruction->attributes | uVar22;
            }
            else {
LAB_001080b8:
              if ((ZVar1 == ZYDIS_MACHINE_MODE_LONG_64) && ((bVar15 & 0xf0) == 0x40)) {
                (instruction->raw).rex.offset = ZVar14;
                uVar13 = unaff_RBP & 0xffffffff;
              }
              else {
                bVar3 = true;
              }
            }
          }
        }
        else if (uVar21 - 0xf2 < 2) {
          local_88.prefixes.group1 = bVar15;
          local_88.prefixes.mandatory_candidate = bVar15;
          local_88.prefixes._0_8_ = CONCAT35(uVar4,local_88.prefixes._0_5_);
          uVar6 = local_88.prefixes._0_8_;
          local_88.prefixes.offset_group2 = SUB81(uVar5,7);
          local_88.prefixes._0_6_ = SUB86(uVar6,0);
          local_88.prefixes.offset_group1 = ZVar14;
          local_88.prefixes.offset_mandatory = ZVar14;
          local_8a = bVar15;
        }
        else {
          if (uVar21 == 0x67) {
            local_88.prefixes.offset_asz_override = ZVar14;
            uVar22 = 0x100000000000;
            goto LAB_00108049;
          }
          if (uVar21 != 0xf0) goto LAB_001080b8;
          local_88.prefixes.has_lock = '\x01';
          uVar6 = local_88.prefixes._0_8_;
          local_88.prefixes._6_2_ = SUB82(uVar5,6);
          local_88.prefixes._0_5_ = SUB85(uVar6,0);
          local_88.prefixes.offset_lock = ZVar14;
        }
LAB_0010804d:
        ZVar10 = ZVar11;
        if (!bVar3) {
          if ((byte)uVar13 != bVar15 && (byte)uVar13 != 0) {
            (instruction->raw).rex.offset = '\0';
            uVar13 = 0;
          }
          bVar16 = (instruction->raw).prefix_count;
          (instruction->raw).prefix_count = bVar16 + 1;
          (instruction->raw).prefixes[bVar16].value = bVar15;
          if (0xe < bVar17) {
            __assert_fail("instruction->length < 15",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x119,
                          "void ZydisInputSkip(ZydisDecoderState *, ZydisDecodedInstruction *)");
          }
          bVar17 = bVar17 + 1;
          instruction->length = bVar17;
          pbVar19 = pbVar19 + 1;
          ZVar20 = ZVar20 - 1;
          ZVar14 = ZVar14 + '\x01';
          local_88.buffer = pbVar19;
          local_88.buffer_len = ZVar20;
        }
      }
      ZVar11 = ZVar10;
      if (!bVar2) goto LAB_001081b5;
    } while (!bVar3);
    uVar22 = instruction->attributes;
    if ((uVar22 & 0x80000000000) != 0) {
      (instruction->raw).prefixes[local_88._40_8_ & 0xff].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
    }
    if ((uVar22 & 0x100000000000) != 0) {
      (instruction->raw).prefixes[(ulong)local_88._40_8_ >> 8 & 0xff].type =
           ZYDIS_PREFIX_TYPE_EFFECTIVE;
    }
    bVar17 = (byte)uVar13;
    if (bVar17 != 0) {
      (instruction->raw).prefixes[(instruction->raw).rex.offset].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
      if ((bVar17 & 0xf0) != 0x40) {
        __assert_fail("(data & 0xF0) == 0x40",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x17a,
                      "void ZydisDecodeREX(ZydisDecoderContext *, ZydisDecodedInstruction *, ZyanU8)"
                     );
      }
      bVar15 = (byte)(uVar13 >> 3) & 1;
      bVar16 = (byte)(uVar13 >> 2) & 1;
      bVar18 = (byte)(uVar13 >> 1) & 1;
      instruction->attributes = uVar22 | 4;
      (instruction->raw).rex.W = bVar15;
      (instruction->raw).rex.R = bVar16;
      (instruction->raw).rex.X = bVar18;
      (instruction->raw).rex.B = bVar17 & 1;
      pZVar12 = &local_50;
      if (context != (ZydisDecoderContext *)0x0) {
        pZVar12 = context;
      }
      (pZVar12->vector_unified).W = bVar15;
      (pZVar12->vector_unified).R = bVar16;
      (pZVar12->vector_unified).X = bVar18;
      (pZVar12->vector_unified).B = bVar17 & 1;
    }
    ZVar11 = 0x100000;
    if ((ZVar1 != ZYDIS_MACHINE_MODE_LONG_64) && (local_88.prefixes.group2 == '>')) {
      local_88.prefixes.offset_notrack = local_88.prefixes.offset_group2;
    }
LAB_001081b5:
    if (-1 < (int)ZVar11) {
      ZVar10 = ZydisDecodeInstruction(&local_88,instruction);
      ZVar11 = 0x100000;
      if ((int)ZVar10 < 0) {
        ZVar11 = ZVar10;
      }
    }
  }
  return ZVar11;
}

Assistant:

ZyanStatus ZydisDecoderDecodeInstruction(const ZydisDecoder* decoder, ZydisDecoderContext* context,
    const void* buffer, ZyanUSize length, ZydisDecodedInstruction* instruction)
{
    if (!decoder || !instruction)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (!buffer || !length)
    {
        return ZYDIS_STATUS_NO_MORE_DATA;
    }

    ZydisDecoderState state;
    ZYAN_MEMSET(&state, 0, sizeof(state));
    state.decoder = decoder;
    state.buffer = (const ZyanU8*)buffer;
    state.buffer_len = length;
    state.prefixes.offset_notrack = -1;

    ZydisDecoderContext default_context;
    if (!context)
    {
        // Use a fallback context if no custom one has been provided
        context = &default_context;
    }
    ZYAN_MEMSET(context, 0, sizeof(*context));
    state.context = context;

    ZYAN_MEMSET(instruction, 0, sizeof(*instruction));
    instruction->machine_mode = decoder->machine_mode;
    instruction->stack_width = 16 << decoder->stack_width;

    ZYAN_CHECK(ZydisCollectOptionalPrefixes(&state, instruction));
    ZYAN_CHECK(ZydisDecodeInstruction(&state, instruction));

    return ZYAN_STATUS_SUCCESS;
}